

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O1

int __thiscall
QDateTimeParser::findMonth
          (QDateTimeParser *this,QStringView str,int startMonth,int sectionIndex,int year,
          QString *usedMonth,int *used)

{
  int iVar1;
  SectionNode *pSVar2;
  int month;
  long in_FS_OFFSET;
  QLocale l;
  ShortVector<QString> monthNames;
  QString local_1a8;
  QLocale local_190;
  undefined1 local_188 [336];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = sectionNode(this,sectionIndex);
  if (pSVar2->type == MonthSection) {
    iVar1 = pSVar2->count;
    local_190.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
    (*this->_vptr_QDateTimeParser[6])(&local_190,this);
    memset(local_188,0xaa,0x150);
    local_188._0_8_ = 0xd;
    local_188._8_8_ = 0;
    local_188._16_8_ = local_188 + 0x18;
    if (startMonth < 0) {
      QVLABase<QString>::reallocate_impl
                ((QVLABase<QString> *)local_188,0xd,local_188 + 0x18,0,(ulong)(0xd - startMonth));
    }
    if (startMonth < 0xd) {
      month = startMonth;
      do {
        QCalendar::monthName(&local_1a8,&this->calendar,&local_190,month,year,(uint)(iVar1 == 3));
        QVLABase<QString>::emplace_back_impl<QString>
                  ((QVLABase<QString> *)local_188,0xd,local_188 + 0x18,&local_1a8);
        if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
          }
        }
        month = month + 1;
      } while (month != 0xd);
    }
    iVar1 = findTextEntry(str,(ShortVector<QString> *)local_188,usedMonth,used);
    if (iVar1 < 0) {
      startMonth = 0;
    }
    std::_Destroy_n_aux<false>::__destroy_n<QString*,long_long>
              ((QString *)local_188._16_8_,local_188._8_8_);
    if ((QString *)local_188._16_8_ != (QString *)(local_188 + 0x18)) {
      QtPrivate::sizedFree((void *)local_188._16_8_,local_188._0_8_ * 0x18);
    }
    iVar1 = startMonth + iVar1;
    QLocale::~QLocale(&local_190);
  }
  else {
    findMonth();
    iVar1 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QDateTimeParser::findMonth(QStringView str, int startMonth, int sectionIndex,
                               int year, QString *usedMonth, int *used) const
{
    const SectionNode &sn = sectionNode(sectionIndex);
    if (sn.type != MonthSection) {
        qWarning("QDateTimeParser::findMonth Internal error");
        return -1;
    }

    QLocale::FormatType type = sn.count == 3 ? QLocale::ShortFormat : QLocale::LongFormat;
    QLocale l = locale();
    ShortVector<QString> monthNames;
    monthNames.reserve(13 - startMonth);
    for (int month = startMonth; month <= 12; ++month)
        monthNames.append(calendar.monthName(l, month, year, type));

    const int index = findTextEntry(str, monthNames, usedMonth, used);
    return index < 0 ? index : index + startMonth;
}